

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitops.h
# Opt level: O0

void incr_be(uint8_t *v,size_t len)

{
  uint8_t uVar1;
  long local_18;
  size_t len_local;
  uint8_t *v_local;
  
  for (local_18 = len - 1;
      (uVar1 = v[local_18], v[local_18] = uVar1 + '\x01', (uint8_t)(uVar1 + '\x01') == '\0' &&
      (local_18 != 0)); local_18 = local_18 + -1) {
  }
  return;
}

Assistant:

static inline void incr_be(uint8_t *v, size_t len)
{
  len--;
  while (1)
  {
    if (++v[len] != 0)
      return;
    if (len == 0)
      return;
    len--;
  }
}